

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  BYTE *ip;
  ulong uVar9;
  ulong *puVar10;
  int iVar11;
  BYTE *ostart;
  uint uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  
  uVar15 = 0;
  uVar7 = 0;
  if (dstSize < 8) {
    return 0;
  }
  if (dstSize == 8) {
    return 0;
  }
  puVar13 = (ulong *)((long)dst + (dstSize - 8));
  uVar14 = srcSize & 0xfffffffffffffffc;
  uVar12 = (uint)srcSize & 3;
  uVar9 = (ulong)uVar12;
  switch(uVar12) {
  case 0:
    puVar10 = (ulong *)dst;
    goto joined_r0x0023a43c;
  case 1:
    uVar9 = 0;
    goto LAB_0023a3ff;
  case 2:
    uVar9 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar14 + 2);
    uVar9 = (ulong)CTable[bVar1].val;
    uVar7 = (uint)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar14 + 1);
  uVar9 = (ulong)CTable[bVar1].val << ((byte)uVar7 & 0x3f) | uVar9;
  uVar7 = CTable[bVar1].nbBits + uVar7;
LAB_0023a3ff:
  uVar9 = (ulong)CTable[*(byte *)((long)src + uVar14)].val << ((byte)uVar7 & 0x3f) | uVar9;
  uVar7 = CTable[*(byte *)((long)src + uVar14)].nbBits + uVar7;
  puVar10 = (ulong *)((ulong)(uVar7 >> 3) + (long)dst);
  if (puVar13 < puVar10) {
    puVar10 = puVar13;
  }
  *(ulong *)dst = uVar9;
  uVar15 = (ulong)(uVar7 & 7);
  uVar9 = uVar9 >> ((byte)uVar7 & 0x38);
joined_r0x0023a43c:
  for (; uVar14 != 0; uVar14 = uVar14 - 4) {
    bVar1 = *(byte *)((long)src + (uVar14 - 1));
    iVar11 = (uint)CTable[bVar1].nbBits + (int)uVar15;
    bVar2 = *(byte *)((long)src + (uVar14 - 2));
    iVar8 = (uint)CTable[bVar2].nbBits + iVar11;
    bVar3 = *(byte *)((long)src + (uVar14 - 3));
    iVar5 = (uint)CTable[bVar3].nbBits + iVar8;
    bVar4 = *(byte *)((long)src + (uVar14 - 4));
    uVar15 = (ulong)CTable[bVar4].val << ((byte)iVar5 & 0x3f) |
             (ulong)CTable[bVar3].val << ((byte)iVar8 & 0x3f) |
             (ulong)CTable[bVar2].val << ((byte)iVar11 & 0x3f) |
             (ulong)CTable[bVar1].val << (sbyte)uVar15 | uVar9;
    uVar7 = (uint)CTable[bVar4].nbBits + iVar5;
    puVar16 = (ulong *)((ulong)(uVar7 >> 3) + (long)puVar10);
    if (puVar13 < puVar16) {
      puVar16 = puVar13;
    }
    uVar9 = uVar15 >> ((byte)uVar7 & 0x38);
    *puVar10 = uVar15;
    uVar15 = (ulong)(uVar7 & 7);
    puVar10 = puVar16;
  }
  uVar7 = (int)uVar15 + 1;
  puVar16 = (ulong *)((ulong)(uVar7 >> 3) + (long)puVar10);
  if (puVar13 < puVar16) {
    puVar16 = puVar13;
  }
  *puVar10 = uVar9 | 1L << uVar15;
  sVar6 = 0;
  if (puVar16 < puVar13) {
    sVar6 = (long)puVar16 - ((long)dst + ((ulong)((uVar7 & 7) == 0) - 1));
  }
  return sVar6;
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    (void)bmi2;
    return HUF_compress1X_usingCTable_internal_body(dst, dstSize, src, srcSize, CTable);
}